

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

bool iutest::internal::iuOperatorEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
               (char (*v1) [4],basic_string_view<char,_std::char_traits<char>_> *v2)

{
  int iVar1;
  size_t __n;
  bool bVar2;
  
  __n = strlen(*v1);
  if (__n == v2->_M_len) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(v1,v2->_M_str,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}